

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void __thiscall jpgd::jpeg_decoder::find_eoi(jpeg_decoder *this)

{
  jpeg_decoder *in_RDI;
  jpeg_decoder *unaff_retaddr;
  jpeg_decoder *this_00;
  
  if (in_RDI->m_progressive_flag == 0) {
    in_RDI->m_bits_left = 0x10;
    this_00 = in_RDI;
    get_bits(in_RDI,(int)((ulong)in_RDI >> 0x20));
    get_bits(this_00,(int)((ulong)in_RDI >> 0x20));
    process_markers(unaff_retaddr);
  }
  in_RDI->m_total_bytes_read = in_RDI->m_total_bytes_read - in_RDI->m_in_buf_left;
  return;
}

Assistant:

void jpeg_decoder::find_eoi()
	{
		if (!m_progressive_flag)
		{
			// Attempt to read the EOI marker.
			//get_bits_no_markers(m_bits_left & 7);

			// Prime the bit buffer
			m_bits_left = 16;
			get_bits(16);
			get_bits(16);

			// The next marker _should_ be EOI
			process_markers();
		}

		m_total_bytes_read -= m_in_buf_left;
	}